

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test::
~TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
           *this)

{
  TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test
  *this_local;
  
  ~TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutComparator_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutComparator)
{
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}